

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataControllerDefault.cpp
# Opt level: O2

bool __thiscall
Rml::DataControllerValue::Initialize
          (DataControllerValue *this,DataModel *model,Element *element,String *variable_name,
          String *param_4)

{
  code *pcVar1;
  bool bVar2;
  DataVariable DVar3;
  DataAddress variable_address;
  
  if (element == (Element *)0x0) {
    bVar2 = Assert("RMLUI_ASSERT(element)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataControllerDefault.cpp"
                   ,0x30);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  DataModel::ResolveAddress(&variable_address,model,variable_name,element);
  if (variable_address.
      super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
      super__Vector_impl_data._M_start !=
      variable_address.
      super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    DVar3 = DataModel::GetVariable(model,&variable_address);
    if (DVar3.definition != (VariableDefinition *)0x0) {
      ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::_M_move_assign
                (&this->address,&variable_address,DVar3.ptr);
    }
    Element::AddEventListener(element,Change,&this->super_EventListener,false);
  }
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
            (&variable_address);
  return variable_address.
         super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
         super__Vector_impl_data._M_start !=
         variable_address.
         super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
         super__Vector_impl_data._M_finish;
}

Assistant:

bool DataControllerValue::Initialize(DataModel& model, Element* element, const String& variable_name, const String& /*modifier*/)
{
	RMLUI_ASSERT(element);

	DataAddress variable_address = model.ResolveAddress(variable_name, element);
	if (variable_address.empty())
		return false;

	if (model.GetVariable(variable_address))
		address = std::move(variable_address);

	element->AddEventListener(EventId::Change, this);

	return true;
}